

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VertexBuffer.cpp
# Opt level: O0

bool sf::VertexBuffer::isAvailable(void)

{
  bool bVar1;
  TransientContextLock local_11;
  TransientContextLock contextLock;
  Lock lock;
  
  Lock::Lock((Lock *)&stack0xfffffffffffffff0,(Mutex *)&(anonymous_namespace)::isAvailableMutex);
  if ((isAvailable::checked & 1U) == 0) {
    isAvailable::checked = true;
    GlResource::TransientContextLock::TransientContextLock(&local_11);
    priv::ensureExtensionsInit();
    isAvailable::available = sfogl_ext_ARB_vertex_buffer_object != 0;
    GlResource::TransientContextLock::~TransientContextLock(&local_11);
  }
  bVar1 = isAvailable::available;
  Lock::~Lock((Lock *)&stack0xfffffffffffffff0);
  return (bool)(bVar1 & 1);
}

Assistant:

bool VertexBuffer::isAvailable()
{
    Lock lock(isAvailableMutex);

    static bool checked = false;
    static bool available = false;

    if (!checked)
    {
        checked = true;

        TransientContextLock contextLock;

        // Make sure that extensions are initialized
        sf::priv::ensureExtensionsInit();

        available = GLEXT_vertex_buffer_object;
    }

    return available;
}